

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_encoder.cc
# Opt level: O0

PointAttribute * __thiscall
draco::PointCloudEncoder::GetPortableAttribute(PointCloudEncoder *this,int32_t parent_att_id)

{
  int32_t iVar1;
  int iVar2;
  reference pvVar3;
  pointer pAVar4;
  undefined4 extraout_var;
  uint in_ESI;
  long in_RDI;
  int32_t parent_att_encoder_id;
  
  if ((-1 < (int)in_ESI) &&
     (iVar1 = PointCloud::num_attributes((PointCloud *)0x1b04e4), (int)in_ESI < iVar1)) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x28),(long)(int)in_ESI);
    std::
    vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
    ::operator[]((vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                  *)(in_RDI + 0x10),(long)*pvVar3);
    pAVar4 = std::
             unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>::
             operator->((unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                         *)0x1b052d);
    iVar2 = (*pAVar4->_vptr_AttributesEncoder[9])(pAVar4,(ulong)in_ESI);
    return (PointAttribute *)CONCAT44(extraout_var,iVar2);
  }
  return (PointAttribute *)0x0;
}

Assistant:

const PointAttribute *PointCloudEncoder::GetPortableAttribute(
    int32_t parent_att_id) {
  if (parent_att_id < 0 || parent_att_id >= point_cloud_->num_attributes()) {
    return nullptr;
  }
  const int32_t parent_att_encoder_id =
      attribute_to_encoder_map_[parent_att_id];
  return attributes_encoders_[parent_att_encoder_id]->GetPortableAttribute(
      parent_att_id);
}